

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_image * nk_image_id(int id)

{
  nk_image *in_RDI;
  
  (in_RDI->handle).ptr = (void *)0x0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->region[0] = 0;
  in_RDI->region[1] = 0;
  *(undefined8 *)(in_RDI->region + 2) = 0;
  (in_RDI->handle).id = id;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->region[0] = 0;
  in_RDI->region[1] = 0;
  in_RDI->region[2] = 0;
  in_RDI->region[3] = 0;
  return in_RDI;
}

Assistant:

NK_API struct nk_image
nk_image_id(int id)
{
struct nk_image s;
nk_zero(&s, sizeof(s));
s.handle.id = id;
s.w = 0; s.h = 0;
s.region[0] = 0;
s.region[1] = 0;
s.region[2] = 0;
s.region[3] = 0;
return s;
}